

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cw_bwt.h
# Opt level: O2

void __thiscall bwtil::cw_bwt::initStructures(cw_bwt *this)

{
  pointer puVar1;
  pointer pvVar2;
  long lVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined8 uVar6;
  bool bVar7;
  byte bVar8;
  int iVar9;
  uint uVar10;
  uint uVar11;
  ostream *poVar12;
  reference pvVar13;
  ulint i_1;
  ulint i;
  ulong uVar14;
  double dVar15;
  long lVar16;
  ulong uVar17;
  value_type vVar18;
  undefined8 extraout_XMM0_Qa;
  undefined1 auVar19 [16];
  undefined1 in_ZMM0 [64];
  undefined1 extraout_var [56];
  undefined1 auVar20 [64];
  undefined8 extraout_XMM1_Qa;
  undefined1 auVar21 [16];
  undefined1 in_ZMM1 [64];
  undefined1 extraout_var_01 [56];
  allocator_type local_109;
  double local_108;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *local_100;
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  *local_f8;
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  *local_f0;
  vector<unsigned_long,_std::allocator<unsigned_long>_> stats;
  _Vector_base<unsigned_long,_std::allocator<unsigned_long>_> local_d0;
  DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> local_b8;
  undefined1 extraout_var_00 [56];
  
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
            *)&local_b8,this->number_of_contexts,(allocator_type *)&stats);
  local_f0 = &this->frequencies;
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::_M_move_assign(local_f0,&local_b8);
  std::
  vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
  ::~vector((vector<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             *)&local_b8);
  lVar16 = 0;
  for (uVar14 = 0; uVar14 < this->number_of_contexts; uVar14 = uVar14 + 1) {
    stats.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,(ulong)this->sigma
               ,(value_type *)&stats,&local_109);
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(((this->frequencies).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar16),&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
    lVar16 = lVar16 + 0x18;
  }
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8,
             this->number_of_contexts,(allocator_type *)&stats);
  local_100 = &this->lengths;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign();
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)&local_b8);
  puVar1 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start;
  for (uVar14 = 0; uVar14 < this->number_of_contexts; uVar14 = uVar14 + 1) {
    puVar1[uVar14] = 0;
  }
  if (this->verbose != false) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "\n*** Scanning input file to compute context frequencies ***");
    poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  uVar14 = 0xffffffffffffffff;
  uVar17 = 0;
  while( true ) {
    iVar9 = (*this->bwIt->_vptr_BackwardIterator[4])();
    if ((char)iVar9 != '\0') break;
    uVar10 = (*this->bwIt->_vptr_BackwardIterator[3])();
    bVar8 = (byte)(this->ca).remapping.
                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                  super__Vector_impl_data._M_start[uVar10 & 0xff];
    puVar1 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
             _M_impl.super__Vector_impl_data._M_start + (this->ca).current_state;
    *puVar1 = *puVar1 + 1;
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((this->frequencies).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (this->ca).current_state,
                         (ulong)bVar8);
    vVar18 = *pvVar13;
    pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                        ((this->frequencies).
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         ._M_impl.super__Vector_impl_data._M_start + (this->ca).current_state,
                         (ulong)bVar8);
    *pvVar13 = vVar18 + 1;
    ContextAutomata::goTo(&this->ca,bVar8);
    auVar4._8_8_ = 0;
    auVar4._0_8_ = this->n;
    auVar5._8_8_ = 0;
    auVar5._0_8_ = uVar17;
    iVar9 = SUB164(auVar5 / auVar4,0);
    if ((((int)uVar14 < iVar9) && (iVar9 % 5 == 0)) && (this->verbose == true)) {
      poVar12 = std::operator<<((ostream *)&std::cout," ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
      in_ZMM1._8_56_ = extraout_var_01;
      in_ZMM1._0_8_ = extraout_XMM1_Qa;
      in_ZMM0._8_56_ = extraout_var;
      in_ZMM0._0_8_ = extraout_XMM0_Qa;
      poVar12 = std::operator<<(poVar12,"% done.");
      std::endl<char,std::char_traits<char>>(poVar12);
      uVar14 = SUB168(auVar5 / auVar4,0) & 0xffffffff;
    }
    uVar17 = uVar17 + 100;
  }
  puVar1 = (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
           .super__Vector_impl_data._M_start + (this->ca).current_state;
  *puVar1 = *puVar1 + 1;
  pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at
                      ((this->frequencies).
                       super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start + (this->ca).current_state,0);
  *pvVar13 = *pvVar13 + 1;
  computeEmpiricalEntropy(this);
  if (this->verbose == true) {
    poVar12 = std::operator<<((ostream *)&std::cout," Done.\n");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  dVar15 = 0.0;
  uVar14 = (this->n * 10) / this->number_of_contexts;
  local_b8.number_of_internal_nodes = '\0';
  local_b8.sigma = '\0';
  local_b8.sigma_0 = '\0';
  local_b8.s = '\0';
  local_b8._4_4_ = 0;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
            (&stats,0x15,(value_type *)&local_b8,&local_109);
  local_f8 = (vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
              *)(uVar14 / 0x14);
  while( true ) {
    auVar21 = in_ZMM1._8_16_;
    auVar19 = in_ZMM0._0_16_;
    if (this->number_of_contexts <= (ulong)dVar15) break;
    uVar17 = (local_100->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
             super__Vector_impl_data._M_start[(long)dVar15];
    if (uVar17 < uVar14) {
      uVar17 = uVar17 / (ulong)local_f8 & 0xffffffff;
      local_108 = dVar15;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&stats,uVar17);
      vVar18 = *pvVar13;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&stats,uVar17);
      dVar15 = local_108;
    }
    else {
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&stats,0x14);
      vVar18 = *pvVar13;
      pvVar13 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::at(&stats,0x14);
    }
    dVar15 = (double)((long)dVar15 + 1);
    *pvVar13 = vVar18 + 1;
  }
  uVar14 = this->n / this->number_of_contexts;
  bVar8 = this->verbose;
  if ((bool)bVar8 != false) {
    poVar12 = std::operator<<((ostream *)&std::cout," Expected context size (if uniform text) is ");
    poVar12 = std::ostream::_M_insert<unsigned_long>((ulong)poVar12);
    poVar12 = std::operator<<(poVar12," characters");
    std::endl<char,std::char_traits<char>>(poVar12);
    bVar8 = this->verbose;
  }
  auVar19 = vcvtusi2sd_avx512f(auVar19,uVar14 + 1);
  auVar20._0_8_ = log2(auVar19._0_8_);
  auVar20._8_56_ = extraout_var_00;
  iVar9 = vcvttsd2usi_avx512f(auVar20._0_16_);
  auVar19._0_8_ = (double)(int)(0x100 / (ulong)(iVar9 + 1));
  auVar19._8_8_ = auVar21._8_8_;
  auVar19 = vsqrtsd_avx(auVar19,auVar19);
  uVar11 = vcvttsd2usi_avx512f(auVar19);
  auVar19 = vcvtusi2sd_avx512f(auVar21,(int)(uVar14 >> 0xc) + 1);
  uVar10 = 2;
  if (2 < uVar11) {
    uVar10 = uVar11;
  }
  local_100 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)log2(auVar19._0_8_);
  auVar19 = vcvtusi2sd_avx512f(auVar21,uVar10);
  local_108 = log2(auVar19._0_8_);
  if ((bVar8 & 1) != 0) {
    std::operator<<((ostream *)&std::cout,
                    " Expected worst-case packed B-tree height (if uniform text) is ");
    auVar21._0_8_ = (double)local_100 / local_108;
    auVar21._8_8_ = 0;
    uVar6 = vcmpsd_avx512f(ZEXT816(0),auVar21,1);
    bVar7 = (bool)((byte)uVar6 & 1);
    poVar12 = std::ostream::_M_insert<double>
                        ((double)((ulong)bVar7 * (long)auVar21._0_8_ +
                                 (ulong)!bVar7 * 0x3ff0000000000000));
    std::endl<char,std::char_traits<char>>(poVar12);
    bVar8 = this->verbose;
  }
  if ((bVar8 & 1) != 0) {
    poVar12 = std::operator<<((ostream *)&std::cout,
                              "\n*** Creating data structures (dynamic compressed strings and partial sums) ***"
                             );
    poVar12 = std::endl<char,std::char_traits<char>>(poVar12);
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
            *)&local_b8,this->number_of_contexts,(allocator_type *)&local_109);
  local_f8 = &this->dynStrings;
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::_M_move_assign(local_f8,&local_b8);
  std::
  vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
  ::~vector((vector<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
             *)&local_b8);
  local_108._0_4_ = -1;
  uVar17 = 0;
  local_100 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)0x0;
  lVar16 = 0;
  for (uVar14 = 0; uVar14 < this->number_of_contexts; uVar14 = uVar14 + 1) {
    std::vector<unsigned_long,_std::allocator<unsigned_long>_>::vector
              ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0,
               (vector<unsigned_long,_std::allocator<unsigned_long>_> *)
               ((long)&(((local_f0->
                         super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start)->
                       super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                       super__Vector_impl_data._M_start + lVar16));
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::DynamicString
              (&local_b8,(vector<unsigned_long,_std::allocator<unsigned_long>_> *)&local_d0);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::operator=
              ((DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_> *)
               (&((local_f8->
                  super__Vector_base<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>,_std::allocator<bwtil::DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>_>_>
                  )._M_impl.super__Vector_impl_data._M_start)->number_of_internal_nodes +
               (long)local_100),&local_b8);
    DynamicString<bv::bitvector_t<4096UL,_(bv::allocation_policy_t)0>_>::~DynamicString(&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base(&local_d0);
    pvVar2 = (local_f0->
             super__Vector_base<std::vector<unsigned_long,_std::allocator<unsigned_long>_>,_std::allocator<std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    lVar3 = *(long *)((long)&(pvVar2->
                             super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                             _M_impl.super__Vector_impl_data._M_start + lVar16);
    if (*(long *)((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)
                         ._M_impl.super__Vector_impl_data._M_finish + lVar16) != lVar3) {
      *(long *)((long)&(pvVar2->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                       _M_impl.super__Vector_impl_data._M_finish + lVar16) = lVar3;
    }
    iVar9 = (int)(uVar17 / this->number_of_contexts);
    if (((local_108._0_4_ < iVar9) && (iVar9 % 10 == 0)) && (this->verbose == true)) {
      poVar12 = std::operator<<((ostream *)&std::cout," ");
      poVar12 = (ostream *)std::ostream::operator<<(poVar12,iVar9);
      poVar12 = std::operator<<(poVar12,"% done.");
      std::endl<char,std::char_traits<char>>(poVar12);
      local_108._0_4_ = iVar9;
    }
    local_100 = (vector<unsigned_long,_std::allocator<unsigned_long>_> *)((long)local_100 + 0x88);
    lVar16 = lVar16 + 0x18;
    uVar17 = uVar17 + 100;
  }
  computeActualEntropy(this);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_b8,
             this->number_of_contexts,(allocator_type *)&local_109);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::_M_move_assign
            (&this->partial_sums,&local_b8);
  std::vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>::~vector
            ((vector<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_> *)&local_b8);
  lVar16 = 0;
  for (uVar14 = 0; uVar14 < this->number_of_contexts; uVar14 = uVar14 + 1) {
    PartialSums::PartialSums
              ((PartialSums *)&local_b8,this->sigma,
               (this->lengths).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
               _M_impl.super__Vector_impl_data._M_start[uVar14]);
    PartialSums::operator=
              ((PartialSums *)
               (&((this->partial_sums).
                  super__Vector_base<bwtil::PartialSums,_std::allocator<bwtil::PartialSums>_>.
                  _M_impl.super__Vector_impl_data._M_start)->sigma + lVar16),
               (PartialSums *)&local_b8);
    std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
              ((_Vector_base<unsigned_long,_std::allocator<unsigned_long>_> *)
               &local_b8.child0.super__Vector_base<unsigned_short,_std::allocator<unsigned_short>_>.
                _M_impl.super__Vector_impl_data._M_finish);
    lVar16 = lVar16 + 0x28;
  }
  bVar8 = this->verbose;
  if ((bool)bVar8 != false) {
    std::operator<<((ostream *)&std::cout,"\n k-th order empirical entropy of the text is ");
    poVar12 = std::ostream::_M_insert<double>(this->Hk);
    std::endl<char,std::char_traits<char>>(poVar12);
    std::operator<<((ostream *)&std::cout," bits per symbol used (only compressed text): ");
    poVar12 = std::ostream::_M_insert<double>(this->bits_per_symbol);
    std::endl<char,std::char_traits<char>>(poVar12);
    bVar8 = this->verbose;
  }
  if ((bVar8 & 1) != 0) {
    poVar12 = std::operator<<((ostream *)&std::cout,"\nData structures created.");
    std::endl<char,std::char_traits<char>>(poVar12);
  }
  std::_Vector_base<unsigned_long,_std::allocator<unsigned_long>_>::~_Vector_base
            (&stats.super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>);
  return;
}

Assistant:

void initStructures(){

		frequencies = vector<vector<ulint> >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			frequencies[i] = vector<ulint>(sigma,0);

		lengths = vector<ulint>(number_of_contexts);

		for(ulint i=0;i<number_of_contexts;i++)
			lengths[i]=0;

		symbol s;

		ulint symbols_read=0;

		if(verbose) cout << "\n*** Scanning input file to compute context frequencies ***" << endl << endl;

		int perc,last_perc=-1;

		while(not bwIt->begin()){

			s = ca.ASCIItoCode( bwIt->read() );//this symbol has as context the current state of the automata

			lengths[ ca.currentState() ]++;//new symbol in this context:increment

			frequencies[ ca.currentState() ].at(s) = frequencies[ ca.currentState() ].at(s)+1;//increment the frequency of s in the context

			ca.goTo(s);

			perc = (100*symbols_read)/n;

			if(perc>last_perc and (perc%5)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}
			symbols_read++;

		}

		lengths[ ca.currentState() ]++;//first context in the text: will contain only terminator
		frequencies[ ca.currentState() ].at(0)++;//terminator

		computeEmpiricalEntropy();

		if(verbose) cout << " Done.\n" << endl;

		//99 intervals [i,i+100M/100] and one final interval i>100M

		//statistics:
		uint number_of_intervals = 20;
		ulint max_len = (10*n)/number_of_contexts;
		ulint step = max_len / number_of_intervals;
		ulint tot_intervals = number_of_intervals+1;

		vector<ulint> stats = vector<ulint>(tot_intervals,0);

		ulint max=0;
		for(ulint i=0;i<number_of_contexts;i++)
			if(lengths[i]>max)
				max=lengths[i];

		for(ulint i=0;i<number_of_contexts;i++){

			if(lengths[i]>=max_len)
				stats.at(tot_intervals-1) = stats.at(tot_intervals-1)+1;
			else{

				uint pos=lengths[i]/step;
				stats.at(pos) = stats.at(pos)+1;

			}

		}

		ulint exp_context_length = n/number_of_contexts;

		//if(verbose) cout << " Largest context has " << max << " characters" << endl;
		if(verbose) cout << " Expected context size (if uniform text) is " << exp_context_length << " characters" << endl;

		//compute expected packed B-tree height

		{

			uint nr_of_leaves = exp_context_length/W_leafs + 1;
			uint log2n = log2(exp_context_length+1);
			uint d = W_nodes/(log2n+1);
			uint b = sqrt(d); //worst-case tree fanout
			if(b<=1) b=2;
			double exp_height = (log2(nr_of_leaves)/log2(b));
			if(exp_height<=0) exp_height = 1;

			if(verbose) cout << " Expected worst-case packed B-tree height (if uniform text) is " << exp_height << endl ;

		}

		/*if(verbose) cout << " Context length statistics: " << endl;

		if(verbose){

			for(uint i=0;i<tot_intervals-1;i++)
				cout << " [" << i*step << ", " << (i+1)*step << "[ -> " << stats.at(i)<<endl;

			cout << " [ " << max_len <<", inf [ -> " << stats.at(tot_intervals-1)<<endl;

		}*/


		if(verbose) cout << "\n*** Creating data structures (dynamic compressed strings and partial sums) ***" << endl << endl;

		perc=0;
		last_perc=-1;

		dynStrings = vector<dynamic_string_t >(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++){

			dynStrings[i] = dynamic_string_t(frequencies[i]);
			frequencies[i].clear();//free memory

			perc = (100*i)/number_of_contexts;

			if(perc>last_perc and (perc%10)==0 and verbose){
				cout << " " << perc << "% done." << endl;
				last_perc=perc;
			}

		}

		computeActualEntropy();

		partial_sums = vector<PartialSums>(number_of_contexts);
		for(ulint i=0;i<number_of_contexts;i++)
			partial_sums[i] = PartialSums(sigma,lengths[i]);

		if(verbose){

			cout << "\n k-th order empirical entropy of the text is " << empiricalEntropy() << endl;
			cout << " bits per symbol used (only compressed text): " << actualEntropy() << endl;

		}

		if(verbose) cout << "\nData structures created." << endl;

	}